

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O0

Vector3f __thiscall
Vector3f::cubicInterpolate
          (Vector3f *this,Vector3f *p0,Vector3f *p1,Vector3f *p2,Vector3f *p3,float t)

{
  Vector3f VVar1;
  undefined1 local_70 [8];
  Vector3f p1p2_p2p3;
  Vector3f p0p1_p1p2;
  Vector3f p2p3;
  Vector3f p1p2;
  Vector3f p0p1;
  float t_local;
  Vector3f *p3_local;
  Vector3f *p2_local;
  Vector3f *p1_local;
  Vector3f *p0_local;
  
  lerp((Vector3f *)(p1p2.m_elements + 1),p0,p1,t + 1.0);
  lerp((Vector3f *)(p2p3.m_elements + 1),p1,p2,t);
  lerp((Vector3f *)(p0p1_p1p2.m_elements + 1),p2,p3,t - 1.0);
  lerp((Vector3f *)(p1p2_p2p3.m_elements + 1),(Vector3f *)(p1p2.m_elements + 1),
       (Vector3f *)(p2p3.m_elements + 1),(t + 1.0) * 0.5);
  lerp((Vector3f *)local_70,(Vector3f *)(p2p3.m_elements + 1),(Vector3f *)(p0p1_p1p2.m_elements + 1)
       ,t * 0.5);
  VVar1 = lerp(this,(Vector3f *)(p1p2_p2p3.m_elements + 1),(Vector3f *)local_70,t);
  return (Vector3f)VVar1.m_elements;
}

Assistant:

Vector3f Vector3f::cubicInterpolate( const Vector3f& p0, const Vector3f& p1, const Vector3f& p2, const Vector3f& p3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Vector3f p0p1 = Vector3f::lerp( p0, p1, t + 1 );
	Vector3f p1p2 = Vector3f::lerp( p1, p2, t );
	Vector3f p2p3 = Vector3f::lerp( p2, p3, t - 1 );

	// middle level
	Vector3f p0p1_p1p2 = Vector3f::lerp( p0p1, p1p2, 0.5f * ( t + 1 ) );
	Vector3f p1p2_p2p3 = Vector3f::lerp( p1p2, p2p3, 0.5f * t );

	// top level
	return Vector3f::lerp( p0p1_p1p2, p1p2_p2p3, t );
}